

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O2

void __thiscall OpenMD::IndexFinder::IndexFinder(IndexFinder *this,SimInfo *info)

{
  vector<int,_std::allocator<int>_> *this_00;
  EVP_PKEY_CTX *ctx;
  int local_1c;
  
  this->info_ = info;
  this_00 = &this->nObjects_;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalBonds_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalBends_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalTorsions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalInversions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  local_1c = this->info_->nGlobalMols_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_1c);
  ctx = (EVP_PKEY_CTX *)(long)this->info_->nGlobalMols_;
  std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::resize
            (&this->selectionSets_,(size_type)ctx);
  init(this,ctx);
  return;
}

Assistant:

IndexFinder::IndexFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    selectionSets_.resize(info_->getNGlobalMolecules());
    init();
  }